

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_inet_types.c
# Opt level: O1

int ipv6_prefix_store_clb
              (ly_ctx *ctx,char *UNUSED_type_name,char **value_str,lyd_val *value,char **err_msg)

{
  uint *puVar1;
  undefined8 uVar2;
  char **__ptr;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  size_t __n;
  char *local_60;
  char *ptr;
  anon_union_16_2_94730013 addr_bin;
  lyd_val *local_40;
  char **local_38;
  
  pcVar6 = *value_str;
  addr_bin._8_8_ = ctx;
  pcVar4 = strchr(pcVar6,0x2f);
  if (pcVar4 != (char *)0x0) {
    local_40 = value;
    uVar5 = strtoul(pcVar4 + 1,&local_60,10);
    if (uVar5 < 0x81 && *local_60 == '\0') {
      pcVar6 = (char *)malloc(0x32);
      if (pcVar6 == (char *)0x0) {
        *err_msg = (char *)0x0;
      }
      else {
        __n = (long)pcVar4 - (long)*value_str;
        local_38 = err_msg;
        strncpy(pcVar6,*value_str,__n);
        pcVar6[__n] = '\0';
        iVar3 = inet_pton(10,pcVar6,&ptr);
        __ptr = local_38;
        if (iVar3 == 1) {
          lVar7 = 0;
          lVar10 = 0;
          do {
            uVar11 = 0;
            lVar12 = 0;
            do {
              uVar11 = (uint)((ulong)(lVar7 + lVar12) < uVar5) + uVar11 * 2;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0x20);
            puVar1 = (uint *)((long)&ptr + lVar10 * 4);
            *puVar1 = *puVar1 & (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8
                                | uVar11 * 0x1000000);
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + 0x20;
          } while (lVar10 != 4);
          pcVar8 = inet_ntop(10,&ptr,pcVar6,0x2e);
          if (pcVar8 != (char *)0x0) {
            strcat(pcVar6,pcVar4);
            pcVar4 = *value_str;
            iVar3 = strcmp(pcVar6,pcVar4);
            uVar2 = addr_bin._8_8_;
            if (iVar3 == 0) {
              free(pcVar6);
            }
            else {
              lydict_remove(addr_bin._8_8_,pcVar4);
              pcVar6 = (char *)lydict_insert_zc(uVar2,pcVar6);
              *value_str = pcVar6;
              local_40->binary = pcVar6;
            }
            return 0;
          }
          piVar9 = __errno_location();
          pcVar4 = strerror(*piVar9);
          iVar3 = asprintf(__ptr,"Failed to convert IPv6 address (%s).",pcVar4);
          if (iVar3 == -1) {
            *__ptr = (char *)0x0;
          }
        }
        else {
          iVar3 = asprintf(local_38,"Failed to convert IPv6 address \"%s\".",pcVar6);
          if (iVar3 == -1) {
            *__ptr = (char *)0x0;
          }
        }
        free(pcVar6);
      }
      return 1;
    }
    pcVar6 = *value_str;
  }
  iVar3 = asprintf(err_msg,"Invalid IPv6 prefix \"%s\".",pcVar6);
  if (iVar3 == -1) {
    *err_msg = (char *)0x0;
  }
  return 1;
}

Assistant:

static int
ipv6_prefix_store_clb(struct ly_ctx *ctx, const char *UNUSED(type_name), const char **value_str, lyd_val *value, char **err_msg)
{
    char *pref_str, *ptr, *result;
    unsigned long int pref, i, j;
    union {
        struct in6_addr s;
        uint32_t a[4];
    } addr_bin;
    uint32_t mask;

    pref_str = strchr(*value_str, '/');
    if (!pref_str) {
        if (asprintf(err_msg, "Invalid IPv6 prefix \"%s\".", *value_str) == -1) {
            *err_msg = NULL;
        }
        return 1;
    }

    /* learn prefix */
    pref = strtoul(pref_str + 1, &ptr, 10);
    if (ptr[0] || (pref > 128)) {
        if (asprintf(err_msg, "Invalid IPv6 prefix \"%s\".", *value_str) == -1) {
            *err_msg = NULL;
        }
        return 1;
    }

    result = malloc(INET6_ADDRSTRLEN + 4);
    if (!result) {
        *err_msg = NULL;
        return 1;
    }

    /* copy just the network prefix */
    strncpy(result, *value_str, pref_str - *value_str);
    result[pref_str - *value_str] = '\0';

    /* convert it to binary form */
    if (inet_pton(AF_INET6, result, (void *)&addr_bin.s) != 1) {
        if (asprintf(err_msg, "Failed to convert IPv6 address \"%s\".", result) == -1) {
            *err_msg = NULL;
        }
        free(result);
        return 1;
    }

    /* zero host bits */
    for (i = 0; i < 4; ++i) {
        mask = 0;
        for (j = 0; j < 32; ++j) {
            mask <<= 1;
            if (pref > (i * 32) + j) {
                mask |= 1;
            }
        }
        mask = htonl(mask);
        addr_bin.a[i] &= mask;
    }

    /* convert back to string */
    if (!inet_ntop(AF_INET6, (void *)&addr_bin.s, result, INET6_ADDRSTRLEN)) {
        if (asprintf(err_msg, "Failed to convert IPv6 address (%s).", strerror(errno)) == -1) {
            *err_msg = NULL;
        }
        free(result);
        return 1;
    }

    /* add the prefix */
    strcat(result, pref_str);

    if (strcmp(result, *value_str)) {
        /* some conversion took place, update the value */
        lydict_remove(ctx, *value_str);
        *value_str = lydict_insert_zc(ctx, result);
        value->string = *value_str;
    } else {
        free(result);
    }

    return 0;
}